

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O2

bool RunTests(void)

{
  char cVar1;
  ostream *poVar2;
  uint uVar3;
  code *pcVar4;
  code *local_b8;
  char *local_b0;
  code *local_a8;
  char *local_a0;
  code *local_98;
  char *local_90;
  code *local_88;
  char *local_80;
  code *local_78;
  char *local_70;
  code *local_68;
  char *local_60;
  code *local_58;
  char *local_50;
  code *local_48;
  char *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  pcVar4 = TestAssignment;
  local_b8 = TestAssignment;
  local_b0 = "TestAssignment";
  local_a8 = TestConstants;
  local_a0 = "TestConstants";
  local_98 = TestIncrement;
  local_90 = "TestIncrement";
  local_88 = TestComparisons;
  local_80 = "TestComparisons";
  local_78 = TestGetTickCount;
  local_70 = "TestGetTickCount";
  local_68 = TestCompression;
  local_60 = "TestCompression";
  local_58 = TestCompressionNoBias8;
  local_50 = "TestCompressionNoBias8";
  local_48 = TestCompressionNoBias16;
  local_40 = "TestCompressionNoBias16";
  local_38 = 0;
  uStack_30 = 0;
  uVar3 = 1;
  do {
    if (pcVar4 == (code *)0x0) {
LAB_001015f9:
      return pcVar4 == (code *)0x0;
    }
    cVar1 = (*pcVar4)();
    if (cVar1 == '\0') {
      poVar2 = std::operator<<((ostream *)&std::cout,"Test failed: ");
      poVar2 = std::operator<<(poVar2,(&local_b0)[(ulong)(uVar3 - 1) * 2]);
      std::endl<char,std::char_traits<char>>(poVar2);
      goto LAB_001015f9;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Test passed: ");
    poVar2 = std::operator<<(poVar2,(&local_b0)[(ulong)(uVar3 - 1) * 2]);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar4 = (&local_b8)[(ulong)uVar3 * 2];
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

TestDescriptor(TestF fn = nullptr, const char* name = nullptr)
        : Function(fn)
        , Name(name)
    {
    }